

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O0

gost_cipher_info * get_encryption_params(ASN1_OBJECT *obj)

{
  char *__s;
  size_t sVar1;
  ASN1_OBJECT *in_RDI;
  int i;
  char *params;
  gost_cipher_info *param;
  int nid;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  uint reason;
  int in_stack_ffffffffffffffd4;
  int iVar2;
  gost_cipher_info *local_20;
  int local_14;
  gost_cipher_info *local_8;
  
  if (in_RDI == (ASN1_OBJECT *)0x0) {
    __s = get_gost_engine_param(in_stack_ffffffffffffffcc);
    if ((__s == (char *)0x0) || (sVar1 = strlen(__s), sVar1 == 0)) {
      iVar2 = 0;
      while( true ) {
        if (gost_cipher_list[iVar2].nid == 0) {
          local_8 = gost_cipher_list;
          return local_8;
        }
        if (gost_cipher_list[iVar2].nid == 0x3eb) break;
        iVar2 = iVar2 + 1;
      }
      return gost_cipher_list + iVar2;
    }
    local_14 = OBJ_txt2nid(__s);
    if (local_14 == 0) {
      ERR_GOST_error(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,
                     (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
      ERR_add_error_data(3,"Unsupported CRYPT_PARAMS=\'",__s,
                         "\' specified in environment or in config");
      return (gost_cipher_info *)0x0;
    }
  }
  else {
    local_14 = OBJ_obj2nid(in_RDI);
  }
  local_20 = gost_cipher_list;
  while( true ) {
    reason = in_stack_ffffffffffffffd0 & 0xffffff;
    if (local_20->sblock != (gost_subst_block *)0x0) {
      reason = CONCAT13(local_20->nid != local_14,(int3)in_stack_ffffffffffffffd0);
    }
    if ((char)(reason >> 0x18) == '\0') break;
    local_20 = local_20 + 1;
    in_stack_ffffffffffffffd0 = reason;
  }
  if (local_20->sblock == (gost_subst_block *)0x0) {
    ERR_GOST_error(in_stack_ffffffffffffffd4,reason,
                   (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
    local_8 = (gost_cipher_info *)0x0;
  }
  else {
    local_8 = local_20;
  }
  return local_8;
}

Assistant:

const struct gost_cipher_info *get_encryption_params(ASN1_OBJECT *obj)
{
    int nid;
    struct gost_cipher_info *param;
    if (!obj) {
        const char *params = get_gost_engine_param(GOST_PARAM_CRYPT_PARAMS);
        if (!params || !strlen(params)) {
            int i;
            for (i = 0; gost_cipher_list[i].nid != NID_undef; i++)
                if (gost_cipher_list[i].nid == NID_id_tc26_gost_28147_param_Z)
                    return &gost_cipher_list[i];
            return &gost_cipher_list[0];
        }

        nid = OBJ_txt2nid(params);
        if (nid == NID_undef) {
            GOSTerr(GOST_F_GET_ENCRYPTION_PARAMS,
                    GOST_R_INVALID_CIPHER_PARAM_OID);
            ERR_add_error_data(3, "Unsupported CRYPT_PARAMS='",
                params, "' specified in environment or in config");
            return NULL;
        }
    } else {
        nid = OBJ_obj2nid(obj);
    }
    for (param = gost_cipher_list; param->sblock != NULL && param->nid != nid;
         param++) ;
    if (!param->sblock) {
        GOSTerr(GOST_F_GET_ENCRYPTION_PARAMS, GOST_R_INVALID_CIPHER_PARAMS);
        return NULL;
    }
    return param;
}